

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.c
# Opt level: O1

_Bool upb_strtable_next2(upb_strtable *t,upb_StringView *key,upb_value *val,intptr_t *iter)

{
  long *plVar1;
  byte bVar2;
  uint uVar3;
  upb_tabent *puVar4;
  uint *puVar5;
  long lVar6;
  ulong uVar7;
  char *mem;
  bool bVar8;
  
  bVar2 = (t->t).size_lg2;
  if (bVar2 == 0) {
LAB_00129981:
    uVar7 = 0xfffffffffffffffe;
  }
  else {
    uVar7 = *iter;
    lVar6 = uVar7 * 0x18;
    do {
      uVar7 = uVar7 + 1;
      if ((ulong)(long)(1 << (bVar2 & 0x1f)) <= uVar7) goto LAB_00129981;
      plVar1 = (long *)((long)&(t->t).entries[1].key + lVar6);
      lVar6 = lVar6 + 0x18;
    } while (*plVar1 == 0);
  }
  bVar8 = uVar7 < (ulong)(long)(1 << (bVar2 & 0x1f));
  if (bVar8 && bVar2 != 0) {
    puVar4 = (t->t).entries;
    puVar5 = (uint *)puVar4[uVar7].key;
    uVar3 = *puVar5;
    key->data = (char *)(puVar5 + 1);
    key->size = (ulong)uVar3;
    val->val = puVar4[uVar7].val.val;
    *iter = uVar7;
  }
  return bVar8 && bVar2 != 0;
}

Assistant:

bool upb_strtable_next2(const upb_strtable* t, upb_StringView* key,
                        upb_value* val, intptr_t* iter) {
  size_t tab_idx = next(&t->t, *iter);
  if (tab_idx < upb_table_size(&t->t)) {
    upb_tabent* ent = &t->t.entries[tab_idx];
    uint32_t len;
    key->data = upb_tabstr(ent->key, &len);
    key->size = len;
    *val = _upb_value_val(ent->val.val);
    *iter = tab_idx;
    return true;
  }

  return false;
}